

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4faa5c::ReferenceType::printRight(ReferenceType *this,OutputStream *s)

{
  bool bVar1;
  Node *this_00;
  StringView R;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> pVar2;
  
  if (this->Printing == false) {
    this->Printing = true;
    pVar2 = collapse(this,s);
    this_00 = pVar2.second;
    bVar1 = Node::hasArray(this_00,s);
    if ((bVar1) || (bVar1 = Node::hasFunction(this_00,s), bVar1)) {
      R.Last = "";
      R.First = ")";
      OutputStream::operator+=(s,R);
    }
    (*this_00->_vptr_Node[5])(this_00,s);
    this->Printing = false;
    return;
  }
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += ")";
    Collapsed.second->printRight(s);
  }